

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retLvalue.c
# Opt level: O2

int Abc_NtkRetimeLValue(Abc_Ntk_t *pNtk,int nIterLimit,int fVerbose)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vLatches;
  void **ppvVar3;
  ulong uVar4;
  Abc_Obj_t *pAVar5;
  Vec_Int_t *p;
  int iVar6;
  ulong uVar7;
  char *__function;
  char *__assertion;
  uint uVar8;
  uint uVar9;
  int iVar10;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assertion = "Abc_NtkIsLogic( pNtk )";
    __function = "int Abc_NtkRetimeLValue(Abc_Ntk_t *, int, int)";
    uVar2 = 0x41;
LAB_00407bc1:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retLvalue.c"
                  ,uVar2,__function);
  }
  iVar1 = pNtk->nObjCounts[8];
  uVar2 = Abc_NtkLevel(pNtk);
  vNodes = Abc_NtkDfs(pNtk,0);
  iVar10 = pNtk->nObjCounts[8];
  vLatches = (Vec_Ptr_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < iVar10 - 1U) {
    iVar6 = iVar10;
  }
  vLatches->nSize = 0;
  vLatches->nCap = iVar6;
  if (iVar6 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar6 << 3);
  }
  vLatches->pArray = ppvVar3;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    uVar9 = pNtk->vObjs->nSize + 500;
    Vec_IntGrow(&pNtk->vTravIds,uVar9);
    uVar4 = 0;
    uVar7 = 0;
    if (0 < (int)uVar9) {
      uVar7 = (ulong)uVar9;
    }
    for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      (pNtk->vTravIds).pArray[uVar4] = 0;
    }
    (pNtk->vTravIds).nSize = uVar9;
  }
  iVar10 = pNtk->nTravIds;
  pNtk->nTravIds = iVar10 + 1;
  if (0x3ffffffe < iVar10) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  for (iVar10 = 0; iVar10 < pNtk->vBoxes->nSize; iVar10 = iVar10 + 1) {
    pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vBoxes,iVar10);
    if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
      Abc_ManCollectLatches_rec(pAVar5,vLatches);
    }
  }
  if (vLatches->nSize != pNtk->nObjCounts[8]) {
    __assert_fail("Vec_PtrSize(vLatches) == Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retLvalue.c"
                  ,0x15b,"Vec_Ptr_t *Abc_ManCollectLatches(Abc_Ntk_t *)");
  }
  iVar10 = Abc_NtkRetimeForPeriod(pNtk,vNodes,vLatches,uVar2,nIterLimit,fVerbose);
  if (iVar10 == 0) {
    Vec_PtrFree(vLatches);
    Vec_PtrFree(vNodes);
    puts("Abc_NtkRetimeGetLags() error: The upper bound on the clock period cannot be computed.");
    p = Vec_IntStart(pNtk->vObjs->nSize + 1);
  }
  else {
    Abc_Clock();
    uVar9 = 0;
    while( true ) {
      uVar8 = uVar9;
      if (uVar2 - uVar8 == 0 || (int)uVar2 < (int)uVar8) {
        __assert_fail("FiMin < FiMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retLvalue.c"
                      ,0xaf,
                      "int Abc_NtkRetimeSearch_rec(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int, int, int)"
                     );
      }
      if (uVar8 + 1 == uVar2) break;
      uVar9 = (int)(uVar2 - uVar8) / 2 + uVar8;
      iVar10 = Abc_NtkRetimeForPeriod(pNtk,vNodes,vLatches,uVar9,nIterLimit,fVerbose);
      if (iVar10 != 0) {
        uVar2 = uVar9;
        uVar9 = uVar8;
      }
    }
    Abc_Clock();
    iVar10 = Abc_NtkRetimeForPeriod(pNtk,vNodes,vLatches,uVar2,nIterLimit,fVerbose);
    if (iVar10 == 0) {
      __assertion = "RetValue";
      __function = "Vec_Int_t *Abc_NtkRetimeGetLags(Abc_Ntk_t *, int, int)";
      uVar2 = 0x79;
      goto LAB_00407bc1;
    }
    for (iVar10 = 0; iVar6 = pNtk->vObjs->nSize, iVar10 < iVar6; iVar10 = iVar10 + 1) {
      pAVar5 = Abc_NtkObj(pNtk,iVar10);
      if (((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) &&
         ((pAVar5->field_6).iTemp < -500000000)) {
        (pAVar5->field_6).pTemp = (void *)0x0;
      }
    }
    p = Vec_IntStart(iVar6 + 1);
    for (iVar10 = 0; iVar10 < pNtk->vObjs->nSize; iVar10 = iVar10 + 1) {
      pAVar5 = Abc_NtkObj(pNtk,iVar10);
      if ((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) {
        Vec_IntWriteEntry(p,pAVar5->Id,
                          (int)(char)((char)((int)(uVar2 * 0x10000 + (pAVar5->field_6).iTemp) /
                                            (int)uVar2) -
                                     ((pAVar5->field_6).iTemp % (int)uVar2 == 0)));
      }
    }
    printf("The best clock period is %3d. (Currently, network is not modified.)\n",(ulong)uVar2);
    Vec_PtrFree(vNodes);
    Vec_PtrFree(vLatches);
  }
  free(p->pArray);
  free(p);
  iVar10 = Abc_NtkCheck(pNtk);
  if (iVar10 == 0) {
    fwrite("Abc_NtkRetimeLValue(): Network check has failed.\n",0x31,1,_stdout);
  }
  return iVar1 - pNtk->nObjCounts[8];
}

Assistant:

int Abc_NtkRetimeLValue( Abc_Ntk_t * pNtk, int nIterLimit, int fVerbose )
{
    Vec_Int_t * vLags;
    int nLatches = Abc_NtkLatchNum(pNtk);
    assert( Abc_NtkIsLogic( pNtk ) );
    // get the lags
    vLags = Abc_NtkRetimeGetLags( pNtk, nIterLimit, fVerbose );
    // compute the retiming
//    Abc_NtkRetimeUsingLags( pNtk, vLags, fVerbose );
    Vec_IntFree( vLags );
    // fix the COs
//    Abc_NtkLogicMakeSimpleCos( pNtk, 0 );
    // check for correctness
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkRetimeLValue(): Network check has failed.\n" );
    // return the number of latches saved
    return nLatches - Abc_NtkLatchNum(pNtk);
}